

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnInfo,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::ColumnInfo,_true> *ret)

{
  uint uVar1;
  undefined6 in_register_00000032;
  vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_> local_38;
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)uVar1 == '\0') {
    local_38.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Read<duckdb::vector<duckdb::ColumnInfo,true>>((type *)&local_38,this);
  }
  ::std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>::_M_move_assign
            (&ret->super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>,&local_38);
  ::std::vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>::~vector(&local_38);
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar1 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}